

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SHA1_Hash * __thiscall
ON_SubDEdgeChain::Hash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDEdgeChain *this)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ON_SubDEdgePtr *pOVar4;
  int iVar5;
  ON__INT32 i;
  ON__INT32 i_00;
  uint uVar6;
  long lVar7;
  ON_SubDEdge *edge;
  ulong uVar8;
  ON_SHA1 sha1;
  ON_SHA1 local_b8;
  
  local_b8.m_state[2] = 0;
  local_b8.m_state[3] = 0;
  local_b8.m_state[4] = 0;
  local_b8.m_bit_count[0] = 0;
  local_b8.m_bit_count[1] = 0;
  local_b8.m_state[0] = 0;
  local_b8.m_state[1] = 0;
  local_b8.m_buffer[0x30] = '\0';
  local_b8.m_buffer[0x31] = '\0';
  local_b8.m_buffer[0x32] = '\0';
  local_b8.m_buffer[0x33] = '\0';
  local_b8.m_buffer[0x34] = '\0';
  local_b8.m_buffer[0x35] = '\0';
  local_b8.m_buffer[0x36] = '\0';
  local_b8.m_buffer[0x37] = '\0';
  local_b8.m_buffer[0x38] = '\0';
  local_b8.m_buffer[0x39] = '\0';
  local_b8.m_buffer[0x3a] = '\0';
  local_b8.m_buffer[0x3b] = '\0';
  local_b8.m_buffer[0x3c] = '\0';
  local_b8.m_buffer[0x3d] = '\0';
  local_b8.m_buffer[0x3e] = '\0';
  local_b8.m_buffer[0x3f] = '\0';
  local_b8.m_buffer[0x20] = '\0';
  local_b8.m_buffer[0x21] = '\0';
  local_b8.m_buffer[0x22] = '\0';
  local_b8.m_buffer[0x23] = '\0';
  local_b8.m_buffer[0x24] = '\0';
  local_b8.m_buffer[0x25] = '\0';
  local_b8.m_buffer[0x26] = '\0';
  local_b8.m_buffer[0x27] = '\0';
  local_b8.m_buffer[0x28] = '\0';
  local_b8.m_buffer[0x29] = '\0';
  local_b8.m_buffer[0x2a] = '\0';
  local_b8.m_buffer[0x2b] = '\0';
  local_b8.m_buffer[0x2c] = '\0';
  local_b8.m_buffer[0x2d] = '\0';
  local_b8.m_buffer[0x2e] = '\0';
  local_b8.m_buffer[0x2f] = '\0';
  local_b8.m_buffer[0x10] = '\0';
  local_b8.m_buffer[0x11] = '\0';
  local_b8.m_buffer[0x12] = '\0';
  local_b8.m_buffer[0x13] = '\0';
  local_b8.m_buffer[0x14] = '\0';
  local_b8.m_buffer[0x15] = '\0';
  local_b8.m_buffer[0x16] = '\0';
  local_b8.m_buffer[0x17] = '\0';
  local_b8.m_buffer[0x18] = '\0';
  local_b8.m_buffer[0x19] = '\0';
  local_b8.m_buffer[0x1a] = '\0';
  local_b8.m_buffer[0x1b] = '\0';
  local_b8.m_buffer[0x1c] = '\0';
  local_b8.m_buffer[0x1d] = '\0';
  local_b8.m_buffer[0x1e] = '\0';
  local_b8.m_buffer[0x1f] = '\0';
  local_b8.m_buffer[0] = '\0';
  local_b8.m_buffer[1] = '\0';
  local_b8.m_buffer[2] = '\0';
  local_b8.m_buffer[3] = '\0';
  local_b8.m_buffer[4] = '\0';
  local_b8.m_buffer[5] = '\0';
  local_b8.m_buffer[6] = '\0';
  local_b8.m_buffer[7] = '\0';
  local_b8.m_buffer[8] = '\0';
  local_b8.m_buffer[9] = '\0';
  local_b8.m_buffer[10] = '\0';
  local_b8.m_buffer[0xb] = '\0';
  local_b8.m_buffer[0xc] = '\0';
  local_b8.m_buffer[0xd] = '\0';
  local_b8.m_buffer[0xe] = '\0';
  local_b8.m_buffer[0xf] = '\0';
  local_b8.m_byte_count = 0;
  local_b8.m_status_bits = 0;
  local_b8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_b8.m_sha1_hash);
  uVar3 = EdgeCount(this);
  if (uVar3 != 0) {
    lVar7 = 0;
    iVar5 = 0;
    do {
      pOVar4 = (ON_SubDEdgePtr *)((long)&((this->m_edge_chain).m_a)->m_ptr + lVar7);
      if ((this->m_edge_chain).m_count <= iVar5) {
        pOVar4 = &ON_SubDEdgePtr::Null;
      }
      if (iVar5 < 0) {
        pOVar4 = &ON_SubDEdgePtr::Null;
      }
      uVar1 = pOVar4->m_ptr;
      uVar8 = uVar1 & 0xfffffffffffffff8;
      if (uVar8 == 0) {
        i = 0;
        ON_SHA1::AccumulateInteger32(&local_b8,0);
        ON_SHA1::AccumulateInteger32(&local_b8,0);
      }
      else {
        ON_SHA1::AccumulateInteger32(&local_b8,*(ON__INT32 *)(uVar8 + 8));
        uVar6 = (uint)uVar1 & 1;
        lVar2 = *(long *)(uVar8 + 0x80 + (ulong)uVar6 * 8);
        i = 0;
        i_00 = 0;
        if (lVar2 != 0) {
          i_00 = *(ON__INT32 *)(lVar2 + 8);
        }
        ON_SHA1::AccumulateInteger32(&local_b8,i_00);
        lVar2 = *(long *)(uVar8 + 0x80 + (ulong)(uVar6 ^ 1) * 8);
        if (lVar2 != 0) {
          i = *(ON__INT32 *)(lVar2 + 8);
        }
      }
      ON_SHA1::AccumulateInteger32(&local_b8,i);
      iVar5 = iVar5 + 1;
      lVar7 = lVar7 + 8;
    } while ((ulong)uVar3 << 3 != lVar7);
  }
  ON_SHA1::Hash(__return_storage_ptr__,&local_b8);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDEdgeChain::Hash() const
{
  ON_SHA1 sha1;
  const unsigned edge_count = this->EdgeCount();
  for (unsigned i = 0; i < edge_count; ++i)
  {
    const ON_SubDEdgePtr eptr = EdgePtr(i);
    sha1.AccumulateInteger32(eptr.EdgeId());
    sha1.AccumulateInteger32(eptr.RelativeVertexId(0));
    sha1.AccumulateInteger32(eptr.RelativeVertexId(1));
  }
  return sha1.Hash();
}